

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_4,_3> *extraout_RDX;
  Matrix<float,_4,_3> *extraout_RDX_00;
  Matrix<float,_4,_3> *mat;
  Type in0;
  MatrixCaseUtils local_9c [12];
  Mat3x4 local_90;
  VecAccess<float,_4,_3> local_60;
  Matrix<float,_4,_3> local_48;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,10>(&local_90,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_3>::Matrix(&local_90,(float *)s_constInMat3x4);
    mat = extraout_RDX_00;
  }
  negate<float,4,3>(&local_48,(MatrixCaseUtils *)&local_90,mat);
  reduceToVec3(local_9c,&local_48);
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,(Vector<float,_3> *)local_9c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}